

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall
Model::update_schoenberg_multiple_kernel
          (Model *this,vector<double,_std::allocator<double>_> *labels,
          vector<int,_std::allocator<int>_> *contextIds,int centerId,double current_lr,
          int numOfKernels,double **kernelCoefficients)

{
  size_t __n;
  pointer piVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  int d_2;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar9 = (ulong)this->dim_size;
  uVar12 = -(ulong)(uVar9 == 0) | uVar9 * 8;
  puVar5 = (undefined8 *)operator_new__(uVar12);
  *puVar5 = 0;
  __n = uVar12 - 8;
  memset(puVar5 + 1,0,__n);
  puVar6 = (undefined8 *)operator_new__(uVar12);
  *puVar6 = 0;
  memset(puVar6 + 1,0,__n);
  puVar7 = (undefined8 *)operator_new__(uVar12);
  *puVar7 = 0;
  memset(puVar7 + 1,0,__n);
  puVar8 = (undefined8 *)operator_new__(uVar12);
  *puVar8 = 0;
  memset(puVar8 + 1,0,__n);
  uVar11 = 0;
  uVar12 = 0;
  if (0 < numOfKernels) {
    uVar12 = (ulong)(uint)numOfKernels;
  }
  for (; piVar1 = (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar11 = uVar11 + 1) {
    ppdVar2 = this->emb0;
    ppdVar3 = this->emb1;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      puVar8[uVar10] = ppdVar3[piVar1[uVar11]][uVar10] - ppdVar2[centerId][uVar10];
    }
    dVar13 = 0.0;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      dVar13 = dVar13 + (double)puVar8[uVar10] * (double)puVar8[uVar10];
    }
    dVar15 = 1.0 / (dVar13 + 1.0);
    dVar16 = 0.0;
    dVar13 = 0.0;
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      dVar14 = pow(dVar15,this->kernelParams[uVar9 + 1]);
      dVar13 = dVar13 + dVar14 * (*kernelCoefficients)[uVar9];
      dVar14 = dVar14 * (*kernelCoefficients)[uVar9] * dVar15;
      dVar16 = dVar16 + dVar14 + dVar14;
    }
    dVar13 = (labels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar11] - dVar13;
    uVar9 = (ulong)this->dim_size;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      puVar7[uVar10] = (double)puVar8[uVar10] * dVar16 * (dVar13 + dVar13);
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      puVar6[uVar10] = (double)puVar7[uVar10] * -current_lr;
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      puVar5[uVar10] = (double)puVar6[uVar10] + (double)puVar5[uVar10];
    }
    ppdVar2 = this->emb1;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      dVar13 = ppdVar2[(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar11]][uVar10];
      ppdVar2[(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11]][uVar10] =
           ((double)puVar6[uVar10] - this->lambda * current_lr * dVar13) + dVar13;
    }
  }
  ppdVar2 = this->emb0;
  for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    dVar13 = ppdVar2[centerId][uVar11];
    ppdVar2[centerId][uVar11] =
         (-this->lambda * current_lr * dVar13 - (double)puVar5[uVar11]) + dVar13;
  }
  operator_delete__(puVar5);
  operator_delete__(puVar6);
  operator_delete__(puVar8);
  operator_delete__(puVar7);
  uVar11 = 0xffffffffffffffff;
  if (0 < numOfKernels) {
    uVar11 = (ulong)(uint)numOfKernels << 3;
  }
  puVar5 = (undefined8 *)operator_new__(uVar11);
  *puVar5 = 0;
  memset(puVar5 + 1,0,uVar11 - 8);
  puVar6 = (undefined8 *)operator_new__(uVar11);
  *puVar6 = 0;
  memset(puVar6 + 1,0,uVar11 - 8);
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 2); uVar11 = uVar11 + 1) {
    dVar13 = 0.0;
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      dVar15 = schoenberg_kernel(this,(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start[uVar11],centerId,
                                 this->kernelParams[uVar9 + 1]);
      puVar5[uVar9] = dVar15;
      dVar13 = dVar13 + dVar15 * (*kernelCoefficients)[uVar9];
    }
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      dVar15 = (labels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar11] - dVar13;
      puVar6[uVar9] = (double)puVar6[uVar9] - (dVar15 + dVar15) * (double)puVar5[uVar9];
    }
  }
  pdVar4 = *kernelCoefficients;
  for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    dVar13 = pdVar4[uVar11];
    pdVar4[uVar11] =
         ((double)puVar6[uVar11] * -current_lr - this->beta * current_lr * dVar13) + dVar13;
  }
  operator_delete__(puVar5);
  return;
}

Assistant:

void Model::update_schoenberg_multiple_kernel(vector <double> labels, vector <int> contextIds, int centerId, double current_lr, int numOfKernels, double *&kernelCoefficients) {

    /* ----------- Update embedding vectors ----------- */
    double *neule;
    double *g, *temp_g;
    double eta, e, *diff,  *z;
    double var;
    double *e_values;

    neule = new double[this->dim_size]{0};
    g = new double[this->dim_size]{0};
    temp_g = new double[this->dim_size]{0};
    z = new double[this->dim_size]{0};
    diff = new double[this->dim_size]{0};
    e_values = new double[this->dim_size]{0};
    double e_values_sum=0;
    double e_values_sum_ext=0;
    double f;

    for(int i = 0; i < contextIds.size(); i++) {

        for (int d = 0; d < this->dim_size; d++)
            diff[d] = this->emb1[contextIds[i]][d] - this->emb0[centerId][d];

        eta = 0.0;
        for (int d = 0; d < this->dim_size; d++)
            eta += diff[d]*diff[d];
        eta = 1.0 / ( 1.0 + eta ); // eta = (1 + (x-y)^2 ) ^ {-1}

        e_values_sum = 0;
        e_values_sum_ext = 0;
        for(int k=0; k < numOfKernels; k++) {
            e = pow(eta, this->kernelParams[k+1]); // ( 1 + (x-y) )^{-\alpha}

            e_values[k] = kernelCoefficients[k] * e;
            e_values_sum += e_values[k];
            e_values_sum_ext += e_values[k] * eta * ( 2.0 );
        }

        f = 2.0 * ( labels[i] - e_values_sum  ) * ( e_values_sum_ext );
        for (int d = 0; d < this->dim_size; d++)
            z[d] = f * ( diff[d] );

        for (int d = 0; d < this->dim_size; d++)
            g[d] = -current_lr * z[d]; // minus comes from the objective function, minimization

        for (int d = 0; d < this->dim_size; d++)
            neule[d] += g[d];

        for (int d = 0; d < this->dim_size; d++)
            this->emb1[contextIds[i]][d] += g[d] - current_lr*this->lambda*(this->emb1[contextIds[i]][d]);
    }
    for (int d = 0; d < this->dim_size; d++)
        this->emb0[centerId][d] += -neule[d] - current_lr*this->lambda*(this->emb0[centerId][d]);


    delete[] neule;
    delete [] g;
    delete [] temp_g;
    delete [] diff;
    delete [] z;
    delete [] e_values;
    /* ------------------------------------------------ */

    /* ---------- Update kernel coefficients ---------- */
    double kernelSum;
    double *ker, *totalKer;

    ker = new double[numOfKernels]{0};
    totalKer = new double[numOfKernels]{0};

    for(int i = 0; i < contextIds.size(); i++) {
        kernelSum = 0;
        for (int k = 0; k < numOfKernels; k++) {
            ker[k] = this->schoenberg_kernel(contextIds[i], centerId, this->kernelParams[k + 1]);
            kernelSum += kernelCoefficients[k] * ker[k];
        }
        for (int k = 0; k < numOfKernels; k++)
            totalKer[k] += 2.0 * ( labels[i] - kernelSum ) * -ker[k];
    }

    for (int k = 0; k < numOfKernels; k++)
        kernelCoefficients[k] += -current_lr * totalKer[k] - current_lr * this->beta * kernelCoefficients[k];

    delete[] ker;
    /* ------------------------------------------------ */


    /* ----------- Update embedding vectors ----------- */
//    double *neule;
//    double *g, *temp_g;
//    neule = new double[this->dim_size]{0};
//    g = new double[this->dim_size]{0};
//    temp_g = new double[this->dim_size]{0};
//
//
//    for (int i = 0; i < contextIds.size(); i++) {
//
//        for (int k = 0; k < numOfKernels; k++) {
//
//            this->get_schoenberg_grad(temp_g, labels[i], this->kernelParams[k + 1], contextIds[i], centerId, current_lr);
//
//            for (int d = 0; d < this->dim_size; d++)
//                g[d] += (1.0 / numOfKernels) * temp_g[d];
//
//        }
//
//        for (int d = 0; d < this->dim_size; d++)
//            neule[d] += g[d];
//
//        for (int d = 0; d < this->dim_size; d++)
//            this->emb1[contextIds[i]][d] += g[d] - current_lr * this->lambda * (this->emb1[contextIds[i]][d]);
//    }
//    for (int d = 0; d < this->dim_size; d++)
//        this->emb0[centerId][d] += -neule[d] - current_lr * this->lambda * (this->emb0[centerId][d]);
//
//
//    delete[] neule;
//    delete[] g;
//    delete[] temp_g;
    /* ------------------------------------------------ */

}